

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O3

void __thiscall
Fluid::draw_particles_ssf
          (Fluid *this,RenderTexture *scene_texture,mat4 *projection,mat4 *view,vec4 *viewport)

{
  VAO *this_00;
  PFNGLUNIFORM1IPROC p_Var1;
  PFNGLUNIFORM2IVPROC p_Var2;
  PFNGLUNIFORM3FVPROC p_Var3;
  PFNGLUNIFORM4FVPROC p_Var4;
  PFNGLUNIFORMMATRIX4FVPROC p_Var5;
  GLint GVar6;
  socklen_t sVar7;
  mat4 *pmVar8;
  GLfloat *pGVar9;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  int iVar10;
  GLuint __fd;
  ulong uVar11;
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  GLfloat local_70 [16];
  
  gfx::Program::use(&this->ssf_spheres_program);
  set_common_uniforms(this,&this->ssf_spheres_program);
  p_Var5 = glad_glUniformMatrix4fv;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"projection","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,(GLchar *)local_90[0]);
  (*p_Var5)(GVar6,1,'\0',(GLfloat *)projection);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  p_Var5 = glad_glUniformMatrix4fv;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"view","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,(GLchar *)local_b0[0]);
  pmVar8 = view;
  (*p_Var5)(GVar6,1,'\0',(GLfloat *)view);
  sVar7 = (socklen_t)pmVar8;
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  p_Var4 = glad_glUniform4fv;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"viewport","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,(GLchar *)local_d0[0]);
  (*p_Var4)(GVar6,1,(GLfloat *)viewport);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  p_Var3 = glad_glUniform3fv;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"look","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,(GLchar *)local_f0[0]);
  iVar10 = 1;
  (*p_Var3)(GVar6,1,(GLfloat *)&this->look);
  __addr = extraout_RDX;
  if (local_f0[0] != local_e0) {
    uVar11 = local_e0[0] + 1;
    operator_delete(local_f0[0],uVar11);
    iVar10 = (int)uVar11;
    __addr = extraout_RDX_00;
  }
  gfx::VAO::bind(&this->vao,iVar10,__addr,sVar7);
  (*glad_glBindFramebuffer)(0x8d40,(this->ssf_a_texture).fbo_id);
  (*glad_glDrawBuffers)(2,draw_particles_ssf::ssf_draw_buffers);
  (*glad_glClearColor)(0.0,0.0,0.0,0.0);
  (*glad_glClear)(0x4100);
  (*glad_glEnable)(0xbe2);
  (*glad_glDisable)(0xb71);
  (*glad_glBlendFunc)(1,1);
  p_Var1 = glad_glUniform1i;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"pass","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,(GLchar *)local_110[0]);
  (*p_Var1)(GVar6,0);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  (*glad_glDrawBuffers)(2,draw_particles_ssf::first_pass_buffers);
  (*glad_glDrawArraysInstanced)(6,0,this->num_circle_vertices,(this->particle_ssbo)._length);
  (*glad_glDisable)(0xbe2);
  (*glad_glEnable)(0xb71);
  p_Var1 = glad_glUniform1i;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"pass","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_spheres_program).id,(GLchar *)local_130[0]);
  (*p_Var1)(GVar6,1);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  (*glad_glDrawBuffers)(2,draw_particles_ssf::second_pass_buffers);
  sVar7 = (this->particle_ssbo)._length;
  (*glad_glDrawArraysInstanced)(6,0,this->num_circle_vertices,sVar7);
  (*glad_glBindFramebuffer)(0x8d40,0);
  gfx::VAO::unbind(&this->vao);
  (*glad_glUseProgram)(0);
  (*glad_glDisable)(0xbe2);
  gfx::Program::use(&this->ssf_smooth_program);
  p_Var2 = glad_glUniform2iv;
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"resolution","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_smooth_program).id,(GLchar *)local_150[0]);
  (*p_Var2)(GVar6,1,(GLint *)&this->resolution);
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).color1_id);
  (*glad_glBindFramebuffer)(0x8d40,(this->ssf_b_texture).fbo_id);
  iVar10 = 0x127b2c;
  (*glad_glDrawBuffers)(2,draw_particles_ssf::ssf_draw_buffers);
  (*glad_glClearColor)(0.0,0.0,0.0,1.0);
  (*glad_glClear)(0x4100);
  this_00 = &(this->quad).vao;
  gfx::VAO::bind(this_00,iVar10,__addr_00,sVar7);
  (*glad_glDrawArrays)(6,0,(this->quad).buffer._length);
  gfx::VAO::unbind(this_00);
  (*glad_glBindFramebuffer)(0x8d40,0);
  (*glad_glBindTexture)(0xde1,0);
  (*glad_glUseProgram)(0);
  gfx::Program::use(&this->ssf_shade_program);
  p_Var2 = glad_glUniform2iv;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"resolution","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,(GLchar *)local_170[0]);
  (*p_Var2)(GVar6,1,(GLint *)&this->resolution);
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  p_Var5 = glad_glUniformMatrix4fv;
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"projection","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,(GLchar *)local_190[0]);
  (*p_Var5)(GVar6,1,'\0',(GLfloat *)projection);
  if (local_190[0] != local_180) {
    operator_delete(local_190[0],local_180[0] + 1);
  }
  p_Var5 = glad_glUniformMatrix4fv;
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"inv_view","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,(GLchar *)local_1b0[0]);
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(view);
  pGVar9 = local_70;
  (*p_Var5)(GVar6,1,'\0',pGVar9);
  sVar7 = (socklen_t)pGVar9;
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  p_Var3 = glad_glUniform3fv;
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"look","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,(GLchar *)local_1d0[0]);
  (*p_Var3)(GVar6,1,(GLfloat *)&this->look);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  p_Var3 = glad_glUniform3fv;
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"eye","");
  GVar6 = (*glad_glGetUniformLocation)((this->ssf_shade_program).id,(GLchar *)local_1f0[0]);
  (*p_Var3)(GVar6,1,(GLfloat *)&this->eye);
  if (local_1f0[0] != local_1e0) {
    operator_delete(local_1f0[0],local_1e0[0] + 1);
  }
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).color_id);
  (*glad_glActiveTexture)(0x84c1);
  (*glad_glBindTexture)(0xde1,(this->ssf_a_texture).depth_id);
  (*glad_glActiveTexture)(0x84c2);
  (*glad_glBindTexture)(0xde1,(this->ssf_b_texture).color1_id);
  (*glad_glActiveTexture)(0x84c3);
  __fd = scene_texture->color_id;
  (*glad_glBindTexture)(0xde1,__fd);
  gfx::VAO::bind(this_00,__fd,__addr_01,sVar7);
  (*glad_glDrawArrays)(6,0,(this->quad).buffer._length);
  gfx::VAO::unbind(this_00);
  (*glad_glBindTexture)(0xde1,0);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void draw_particles_ssf(const gfx::RenderTexture& scene_texture, const glm::mat4& projection, const glm::mat4& view, const glm::vec4& viewport) {
        constexpr static GLenum ssf_draw_buffers[]{GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1};

        // render spheres and position data
        ssf_spheres_program.use();
            set_common_uniforms(ssf_spheres_program);
            glUniformMatrix4fv(ssf_spheres_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
            glUniformMatrix4fv(ssf_spheres_program.uniform_loc("view"), 1, GL_FALSE, glm::value_ptr(view));
            glUniform4fv(ssf_spheres_program.uniform_loc("viewport"), 1, glm::value_ptr(viewport));
            glUniform3fv(ssf_spheres_program.uniform_loc("look"), 1, glm::value_ptr(look));

            vao.bind();
            ssf_a_texture.bind_framebuffer();

            // clear buffers
            glDrawBuffers(2, ssf_draw_buffers);
            glClearColor(0, 0, 0, 0);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

            // color pass
            glEnable(GL_BLEND);
            glDisable(GL_DEPTH_TEST);
            glBlendFunc(GL_ONE, GL_ONE);
            glUniform1i(ssf_spheres_program.uniform_loc("pass"), 0);
            constexpr static GLenum first_pass_buffers[]{GL_COLOR_ATTACHMENT0, GL_NONE};
            glDrawBuffers(2, first_pass_buffers);
            glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());

            // sphere position pass
            glDisable(GL_BLEND);
            glEnable(GL_DEPTH_TEST);
            glUniform1i(ssf_spheres_program.uniform_loc("pass"), 1);
            constexpr static GLenum second_pass_buffers[]{GL_NONE, GL_COLOR_ATTACHMENT1};
            glDrawBuffers(2, second_pass_buffers);
            glDrawArraysInstanced(GL_TRIANGLE_FAN, 0, num_circle_vertices, particle_ssbo.length());
            
            ssf_a_texture.unbind_framebuffer();
            vao.unbind();
        ssf_spheres_program.disuse();

        // smooth sphere depths, do color thing
        glDisable(GL_BLEND);
        ssf_smooth_program.use();
            glUniform2iv(ssf_smooth_program.uniform_loc("resolution"), 1, glm::value_ptr(resolution));
            glActiveTexture(GL_TEXTURE0);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.color1_id);
            ssf_b_texture.bind_framebuffer();
            glDrawBuffers(2, ssf_draw_buffers);
            glClearColor(0, 0, 0, 1);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            quad.draw();
            ssf_b_texture.unbind_framebuffer();
            glBindTexture(GL_TEXTURE_2D, 0);
        ssf_smooth_program.disuse();

        // shade fluid
        // glDisable(GL_DEPTH_TEST);
        ssf_shade_program.use();
            glUniform2iv(ssf_shade_program.uniform_loc("resolution"), 1, glm::value_ptr(resolution));
            glUniformMatrix4fv(ssf_shade_program.uniform_loc("projection"), 1, GL_FALSE, glm::value_ptr(projection));
            glUniformMatrix4fv(ssf_shade_program.uniform_loc("inv_view"), 1, GL_FALSE, glm::value_ptr(glm::inverse(view)));
            glUniform3fv(ssf_shade_program.uniform_loc("look"), 1, glm::value_ptr(look));
            glUniform3fv(ssf_shade_program.uniform_loc("eye"), 1, glm::value_ptr(eye));
            glActiveTexture(GL_TEXTURE0);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.color_id);
            glActiveTexture(GL_TEXTURE1);
            glBindTexture(GL_TEXTURE_2D, ssf_a_texture.depth_id);
            glActiveTexture(GL_TEXTURE2);
            glBindTexture(GL_TEXTURE_2D, ssf_b_texture.color1_id); // sphere position data
            glActiveTexture(GL_TEXTURE3);
            glBindTexture(GL_TEXTURE_2D, scene_texture.color_id);
            quad.draw();
            glBindTexture(GL_TEXTURE_2D, 0);
        ssf_shade_program.disuse();
    }